

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O0

void err_state_free(void *statep)

{
  undefined4 local_1c;
  uint i;
  ERR_STATE *state;
  void *statep_local;
  
  if (statep != (void *)0x0) {
    for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
      err_clear((err_error_st *)((long)statep + (ulong)local_1c * 0x18));
    }
    free(*(void **)((long)statep + 0x188));
    free(statep);
  }
  return;
}

Assistant:

static void err_state_free(void *statep) {
  ERR_STATE *state = reinterpret_cast<ERR_STATE *>(statep);

  if (state == NULL) {
    return;
  }

  for (unsigned i = 0; i < ERR_NUM_ERRORS; i++) {
    err_clear(&state->errors[i]);
  }
  free(state->to_free);
  free(state);
}